

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O2

void Ptex::v2_2::PtexUtils::blend
               (void *src,float weight,void *dst,bool flip,int rowlen,DataType dt,int nchan)

{
  short *psVar1;
  void *pvVar2;
  float fVar3;
  uint16_t uVar4;
  void *pvVar5;
  undefined7 in_register_00000011;
  long lVar6;
  long lVar7;
  int iVar8;
  
  switch((int)CONCAT71(in_register_00000011,flip) + dt * 2) {
  case dt_uint8:
    for (lVar6 = 0; nchan * rowlen != lVar6; lVar6 = lVar6 + 1) {
      *(char *)((long)dst + lVar6) =
           *(char *)((long)dst + lVar6) + (char)(int)((float)*(byte *)((long)src + lVar6) * weight);
    }
    break;
  case dt_uint16:
    lVar6 = (long)dst + (long)((rowlen + -1) * nchan);
    pvVar5 = (void *)((long)(rowlen * nchan) + (long)src);
    iVar8 = nchan;
    if (nchan < 1) {
      iVar8 = 0;
    }
    for (; src != pvVar5; src = (void *)((long)src + lVar7)) {
      for (lVar7 = 0; iVar8 != (int)lVar7; lVar7 = lVar7 + 1) {
        *(char *)(lVar6 + lVar7) =
             *(char *)(lVar6 + lVar7) + (char)(int)((float)*(byte *)((long)src + lVar7) * weight);
      }
      lVar6 = (lVar6 - nchan * 2) + lVar7;
    }
    break;
  case dt_half:
    for (lVar6 = 0; (long)(nchan * rowlen) * 2 != lVar6; lVar6 = lVar6 + 2) {
      *(short *)((long)dst + lVar6) =
           *(short *)((long)dst + lVar6) +
           (short)(int)((float)*(ushort *)((long)src + lVar6) * weight);
    }
    break;
  case dt_float:
    pvVar5 = (void *)((long)dst + (long)((rowlen + -1) * nchan) * 2);
    pvVar2 = (void *)((long)src + (long)(rowlen * nchan) * 2);
    iVar8 = nchan;
    if (nchan < 1) {
      iVar8 = 0;
    }
    for (; src != pvVar2; src = (void *)((long)src - lVar6)) {
      lVar6 = 0;
      for (lVar7 = 0; iVar8 != (int)lVar7; lVar7 = lVar7 + 1) {
        psVar1 = (short *)((long)pvVar5 + lVar7 * 2);
        *psVar1 = *psVar1 + (short)(int)((float)*(ushort *)((long)src + lVar7 * 2) * weight);
        lVar6 = lVar6 + -2;
      }
      pvVar5 = (void *)((long)pvVar5 + ((long)(nchan * 2) * -2 - lVar6));
    }
    break;
  case 4:
    for (lVar6 = 0; (long)(nchan * rowlen) * 2 != lVar6; lVar6 = lVar6 + 2) {
      fVar3 = *(float *)(PtexHalf::h2fTable + (ulong)*(ushort *)((long)dst + lVar6) * 4);
      uVar4 = PtexHalf::fromFloat(*(float *)(PtexHalf::h2fTable +
                                            (ulong)*(ushort *)((long)src + lVar6) * 4) * weight);
      uVar4 = PtexHalf::fromFloat(fVar3 + *(float *)(PtexHalf::h2fTable + (ulong)uVar4 * 4));
      *(uint16_t *)((long)dst + lVar6) = uVar4;
    }
    break;
  case 5:
    pvVar5 = (void *)((long)dst + (long)((rowlen + -1) * nchan) * 2);
    pvVar2 = (void *)((long)src + (long)(rowlen * nchan) * 2);
    iVar8 = nchan;
    if (nchan < 1) {
      iVar8 = 0;
    }
    for (; src != pvVar2; src = (void *)((long)src - lVar6)) {
      lVar6 = 0;
      for (lVar7 = 0; iVar8 != (int)lVar7; lVar7 = lVar7 + 1) {
        fVar3 = *(float *)(PtexHalf::h2fTable + (ulong)*(ushort *)((long)pvVar5 + lVar7 * 2) * 4);
        uVar4 = PtexHalf::fromFloat(*(float *)(PtexHalf::h2fTable +
                                              (ulong)*(ushort *)((long)src + lVar7 * 2) * 4) *
                                    weight);
        uVar4 = PtexHalf::fromFloat(fVar3 + *(float *)(PtexHalf::h2fTable + (ulong)uVar4 * 4));
        *(uint16_t *)((long)pvVar5 + lVar7 * 2) = uVar4;
        lVar6 = lVar6 + -2;
      }
      pvVar5 = (void *)((long)pvVar5 + ((long)(nchan * 2) * -2 - lVar6));
    }
    break;
  case 6:
    for (lVar6 = 0; (long)(nchan * rowlen) * 4 != lVar6; lVar6 = lVar6 + 4) {
      *(float *)((long)dst + lVar6) =
           *(float *)((long)src + lVar6) * weight + *(float *)((long)dst + lVar6);
    }
    break;
  case 7:
    pvVar5 = (void *)((long)dst + (long)((rowlen + -1) * nchan) * 4);
    pvVar2 = (void *)((long)src + (long)(rowlen * nchan) * 4);
    iVar8 = nchan;
    if (nchan < 1) {
      iVar8 = 0;
    }
    for (; src != pvVar2; src = (void *)((long)src - lVar6)) {
      lVar6 = 0;
      for (lVar7 = 0; iVar8 != (int)lVar7; lVar7 = lVar7 + 1) {
        *(float *)((long)pvVar5 + lVar7 * 4) =
             *(float *)((long)src + lVar7 * 4) * weight + *(float *)((long)pvVar5 + lVar7 * 4);
        lVar6 = lVar6 + -4;
      }
      pvVar5 = (void *)((long)pvVar5 + ((long)(nchan * 2) * -4 - lVar6));
    }
  }
  return;
}

Assistant:

void blend(const void* src, float weight, void* dst, bool flip,
           int rowlen, DataType dt, int nchan)
{
    switch ((dt<<1) | int(flip)) {
    case (dt_uint8<<1):        blend(static_cast<const uint8_t*>(src), weight,
                                     static_cast<uint8_t*>(dst), rowlen, nchan); break;
    case (dt_uint8<<1 | 1):    blendflip(static_cast<const uint8_t*>(src), weight,
                                         static_cast<uint8_t*>(dst), rowlen, nchan); break;
    case (dt_half<<1):         blend(static_cast<const PtexHalf*>(src), weight,
                                     static_cast<PtexHalf*>(dst), rowlen, nchan); break;
    case (dt_half<<1 | 1):     blendflip(static_cast<const PtexHalf*>(src), weight,
                                         static_cast<PtexHalf*>(dst), rowlen, nchan); break;
    case (dt_uint16<<1):       blend(static_cast<const uint16_t*>(src), weight,
                                     static_cast<uint16_t*>(dst), rowlen, nchan); break;
    case (dt_uint16<<1 | 1):   blendflip(static_cast<const uint16_t*>(src), weight,
                                         static_cast<uint16_t*>(dst), rowlen, nchan); break;
    case (dt_float<<1):        blend(static_cast<const float*>(src), weight,
                                     static_cast<float*>(dst), rowlen, nchan); break;
    case (dt_float<<1 | 1):    blendflip(static_cast<const float*>(src), weight,
                                         static_cast<float*>(dst), rowlen, nchan); break;
    }
}